

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

oonf_layer2_data *
oonf_layer2_neigh_query
          (char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx,_Bool get_default)

{
  avl_node *paVar1;
  avl_node *paVar2;
  oonf_layer2_data *poVar3;
  long lVar4;
  bool bVar5;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined8 local_36;
  undefined8 uStack_2e;
  undefined1 local_26;
  
  paVar1 = avl_find(&_oonf_layer2_net_tree,ifname);
  if (paVar1 != (avl_node *)0x0) {
    local_36 = 0;
    uStack_2e = 0;
    local_26 = 0;
    local_48 = *(undefined8 *)l2neigh_addr->_addr;
    uStack_40 = *(undefined8 *)(l2neigh_addr->_addr + 8);
    local_38._0_1_ = l2neigh_addr->_type;
    local_38._1_1_ = l2neigh_addr->_prefix_len;
    paVar2 = avl_find((avl_tree *)&paVar1[-0x21].key,&local_48);
    if ((paVar2 == (avl_node *)0x0) ||
       (lVar4 = (ulong)idx * 0x28, *(long *)((long)&paVar2[-0x12].list + lVar4) == 0)) {
      if (!get_default) {
        return (oonf_layer2_data *)0x0;
      }
    }
    else {
      poVar3 = (oonf_layer2_data *)((long)paVar2 + lVar4 + -0x410);
      bVar5 = *(long *)((long)paVar2 + lVar4 + -0x3f8) == 0;
      if (bVar5) {
        poVar3 = (oonf_layer2_data *)0x0;
      }
      if (!bVar5 || !get_default) {
        return poVar3;
      }
    }
    lVar4 = (ulong)idx * 0x28;
    if (*(long *)((long)&paVar1[-0x12].list + lVar4) != 0) {
      if (*(long *)((long)paVar1 + lVar4 + -0x3f8) == 0) {
        return (oonf_layer2_data *)0x0;
      }
      return (oonf_layer2_data *)((long)paVar1 + lVar4 + -0x410);
    }
  }
  return (oonf_layer2_data *)0x0;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_query(const char *ifname, const struct netaddr *l2neigh_addr,
      enum oonf_layer2_neighbor_index idx, bool get_default) {
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_data *data;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_get(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_get(l2net, l2neigh_addr);
  if (l2neigh != NULL) {
    data = &l2neigh->data[idx];
    if (oonf_layer2_data_has_value(data)) {
      return data;
    }
  }

  if (!get_default) {
    return NULL;
  }

  /* look for network specific default */
  data = &l2net->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}